

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O2

A * __thiscall hiberlite::real_bean<A>::get(real_bean<A> *this)

{
  A *pAVar1;
  runtime_error *this_00;
  
  if (this->forgotten == false) {
    loadLazy(this);
    pAVar1 = this->obj;
    if (pAVar1 == (A *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"NULL pointer exception!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pAVar1 = (A *)0x0;
  }
  return pAVar1;
}

Assistant:

C* real_bean<C>::get()
{
	if(forgotten)
		return NULL;
	loadLazy();
	if(!obj)
		throw std::runtime_error("NULL pointer exception!");
	return obj;
}